

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_inter_block_mode_info
               (AV1Decoder *pbi,DecoderCodingBlock *dcb,MB_MODE_INFO *mbmi,aom_reader *r)

{
  int8_t iVar1;
  INTERINTRA_MODE IVar2;
  uint8_t uVar3;
  MOTION_MODE MVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  scale_factors *psVar9;
  AV1_COMMON *in_RCX;
  aom_internal_error_info *in_RDX;
  MV_REFERENCE_FRAME *in_RSI;
  long in_RDI;
  int_mv *near_mv;
  int mi_col;
  int mi_row;
  int comp_index_ctx;
  int ctx_comp_group_idx;
  int masked_compound_used;
  MV_REFERENCE_FRAME frame;
  int ref;
  INTERINTRA_MODE interintra_mode;
  int interintra;
  int bsize_group;
  int mv_corrupted_flag;
  int ref_mv_idx_1;
  int_mv ref_mv [2];
  int ref_mv_idx;
  int mode_ctx;
  MV_REFERENCE_FRAME ref_frame;
  int is_compound;
  FRAME_CONTEXT *ec_ctx;
  MACROBLOCKD *xd;
  int pts_inref [16];
  int pts [16];
  int16_t inter_mode_ctx [29];
  int_mv ref_mvs [29] [2];
  int_mv nearmv [2];
  int_mv nearestmv [2];
  int allow_hp;
  BLOCK_SIZE bsize;
  FeatureFlags *features;
  AV1_COMMON *cm;
  MV_REFERENCE_FRAME *in_stack_fffffffffffffd68;
  MACROBLOCKD *xd_00;
  int_mv *nearest_mv;
  AV1_COMMON *cm_00;
  int_mv *mvlist;
  undefined4 uVar10;
  AV1_COMMON *cm_01;
  MACROBLOCKD *in_stack_fffffffffffffd80;
  MV_REFERENCE_FRAME *pMVar11;
  MACROBLOCKD *xd_01;
  aom_reader *in_stack_fffffffffffffd88;
  AV1_COMMON *cm_02;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  undefined4 in_stack_fffffffffffffd98;
  undefined2 in_stack_fffffffffffffd9c;
  undefined2 uVar12;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 enable_dual_filter;
  undefined1 in_stack_fffffffffffffd9f;
  InterpFilter interp_filter;
  undefined4 in_stack_fffffffffffffda0;
  int np;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 uVar13;
  uint in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffdc0;
  uint in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffde0;
  char cVar14;
  int_mv *mv;
  MV_REFERENCE_FRAME *ref_frame_00;
  undefined7 in_stack_fffffffffffffdf8;
  PREDICTION_MODE in_stack_fffffffffffffdff;
  MACROBLOCKD *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  MV_REFERENCE_FRAME in_stack_fffffffffffffe0f;
  MB_MODE_INFO *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int_mv *in_stack_fffffffffffffe20;
  int_mv *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  MACROBLOCKD *in_stack_fffffffffffffe40;
  AV1_COMMON *in_stack_fffffffffffffe48;
  int_mv *in_stack_fffffffffffffe50;
  int16_t *in_stack_fffffffffffffe58;
  MV_REFERENCE_FRAME local_188 [64];
  int_mv local_148 [60];
  undefined1 local_58 [12];
  uint local_4c;
  uint local_48;
  BLOCK_SIZE local_41;
  long local_40;
  long local_38;
  AV1_COMMON *local_30;
  aom_internal_error_info *local_28;
  MV_REFERENCE_FRAME *local_20;
  
  local_38 = in_RDI + 0x3b60;
  local_40 = in_RDI + 0x3d4c;
  local_41 = (BLOCK_SIZE)in_RDX->error_code;
  local_48 = (uint)(*(byte *)(in_RDI + 0x3d4d) & 1);
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  memset(local_148,0,0xe8);
  mv = *(int_mv **)(local_20 + 0x2998);
  *(byte *)((long)&local_28->error_code + 3) = 0;
  *(uint8_t *)((long)local_28->detail + 0x86) = '\0';
  *(uint8_t *)((long)local_28->detail + 0x87) = '\0';
  ref_frame_00 = local_20;
  av1_collect_neighbors_ref_counts(in_stack_fffffffffffffd80);
  read_ref_frames((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                  (MACROBLOCKD *)&in_stack_fffffffffffffe28->as_mv,
                  (aom_reader *)&in_stack_fffffffffffffe20->as_mv,in_stack_fffffffffffffe1c,
                  (MV_REFERENCE_FRAME *)in_stack_fffffffffffffe10);
  iVar6 = has_second_ref((MB_MODE_INFO *)local_28);
  iVar1 = av1_ref_frame_type(in_stack_fffffffffffffd68);
  uVar13 = CONCAT13(iVar1,(int3)in_stack_fffffffffffffde0);
  near_mv = (int_mv *)(ref_frame_00 + 0x27b8);
  nearest_mv = local_148;
  pMVar11 = local_188;
  mvlist = (int_mv *)0x0;
  av1_find_mv_refs((AV1_COMMON *)&in_stack_fffffffffffffe20->as_mv,
                   (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   in_stack_fffffffffffffe10,in_stack_fffffffffffffe0f,
                   (uint8_t *)in_stack_fffffffffffffe00,
                   (CANDIDATE_MV (*) [8])
                   CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                   (uint16_t (*) [8])in_stack_fffffffffffffe40,
                   (int_mv (*) [2])in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,
                   in_stack_fffffffffffffe58);
  *(ushort *)((long)local_28->detail + 0x9f) = *(ushort *)((long)local_28->detail + 0x9f) & 0xffcf;
  if ((*(ushort *)((long)local_28->detail + 0x9f) >> 6 & 1) == 0) {
    iVar7 = segfeature_active((segmentation *)(local_38 + 19000),
                              (byte)*(undefined2 *)((long)local_28->detail + 0x9f) & 7,'\x06');
    if ((iVar7 == 0) &&
       (iVar7 = segfeature_active((segmentation *)(local_38 + 19000),
                                  (byte)*(undefined2 *)((long)local_28->detail + 0x9f) & 7,'\a'),
       iVar7 == 0)) {
      av1_mode_context_analyzer((int16_t *)in_stack_fffffffffffffd88,pMVar11);
      if (iVar6 == 0) {
        bVar5 = read_inter_mode((FRAME_CONTEXT *)&mvlist->as_mv,(aom_reader *)&nearest_mv->as_mv,
                                (int16_t)((ulong)near_mv >> 0x30));
        *(byte *)((long)&local_28->error_code + 2) = bVar5;
      }
      else {
        bVar5 = read_inter_compound_mode
                          ((MACROBLOCKD *)&nearest_mv->as_mv,(aom_reader *)&near_mv->as_mv,0);
        *(byte *)((long)&local_28->error_code + 2) = bVar5;
      }
      if (((*(byte *)((long)&local_28->error_code + 2) == 0x10) ||
          (*(byte *)((long)&local_28->error_code + 2) == 0x18)) ||
         (iVar7 = have_nearmv_in_inter_mode(*(byte *)((long)&local_28->error_code + 2)), iVar7 != 0)
         ) {
        read_drl_idx((FRAME_CONTEXT *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (DecoderCodingBlock *)
                     CONCAT17(in_stack_fffffffffffffd9f,
                              CONCAT16(in_stack_fffffffffffffd9e,
                                       CONCAT24(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                                      )),
                     (MB_MODE_INFO *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd88);
      }
    }
    else {
      *(byte *)((long)&local_28->error_code + 2) = 0xf;
    }
  }
  else {
    *(byte *)((long)&local_28->error_code + 2) = 0x11;
  }
  iVar8 = (int)((ulong)pMVar11 >> 0x20);
  uVar12 = (undefined2)iVar6;
  enable_dual_filter = (undefined1)((uint)iVar6 >> 0x10);
  interp_filter = (InterpFilter)((uint)iVar6 >> 0x18);
  iVar7 = is_inter_compound_mode(*(byte *)((long)&local_28->error_code + 2));
  if (CONCAT13(interp_filter,CONCAT12(enable_dual_filter,uVar12)) != iVar7) {
    aom_internal_error(*(aom_internal_error_info **)(ref_frame_00 + 0x29f0),AOM_CODEC_CORRUPT_FRAME,
                       "Prediction mode %d invalid with ref frame %d %d",
                       (ulong)*(byte *)((long)&local_28->error_code + 2),
                       (ulong)(uint)(int)*(char *)((int_mv *)local_28->detail + 2),
                       (ulong)(uint)(int)*(MV_REFERENCE_FRAME *)((long)local_28->detail + 9));
  }
  if ((iVar6 == 0) && (*(byte *)((long)&local_28->error_code + 2) != 0xf)) {
    av1_find_best_ref_mvs(iVar8,mvlist,nearest_mv,near_mv,0);
  }
  uVar10 = (undefined4)((ulong)mvlist >> 0x20);
  if ((iVar6 == 0) || (*(byte *)((long)&local_28->error_code + 2) == 0x17)) {
    if (((*(ushort *)((long)local_28->detail + 0x9f) >> 4 & 3) != 0) &&
       (*(byte *)((long)&local_28->error_code + 2) == 0xe)) {
      pMVar11 = ref_frame_00 +
                (long)(int)(((byte)(*(ushort *)((long)local_28->detail + 0x9f) >> 4) & 3) + 1) * 8 +
                (long)*(char *)((int_mv *)local_28->detail + 2) * 0x40 + 0x2078;
      local_58[0] = pMVar11[0];
      local_58[1] = pMVar11[1];
      local_58[2] = pMVar11[2];
      local_58[3] = pMVar11[3];
    }
  }
  else {
    iVar7 = ((byte)(*(ushort *)((long)local_28->detail + 0x9f) >> 4) & 3) + 1;
    cVar14 = (char)((uint)uVar13 >> 0x18);
    local_58._8_4_ = *(undefined4 *)(ref_frame_00 + (long)cVar14 * 0x40 + 0x2078);
    local_4c = *(uint *)(ref_frame_00 + (long)cVar14 * 0x40 + 0x207c);
    pMVar11 = ref_frame_00 + (long)iVar7 * 8 + (long)cVar14 * 0x40 + 0x2078;
    local_58[0] = pMVar11[0];
    local_58[1] = pMVar11[1];
    local_58[2] = pMVar11[2];
    local_58[3] = pMVar11[3];
    local_58._4_4_ = *(undefined4 *)(ref_frame_00 + (long)iVar7 * 8 + (long)cVar14 * 0x40 + 0x207c);
    lower_mv_precision(&nearest_mv->as_mv,(int)((ulong)near_mv >> 0x20),(int)near_mv);
    lower_mv_precision(&nearest_mv->as_mv,(int)((ulong)near_mv >> 0x20),(int)near_mv);
    lower_mv_precision(&nearest_mv->as_mv,(int)((ulong)near_mv >> 0x20),(int)near_mv);
    lower_mv_precision(&nearest_mv->as_mv,(int)((ulong)near_mv >> 0x20),(int)near_mv);
  }
  if (iVar6 != 0) {
    compound_ref0_mode(*(byte *)((long)&local_28->error_code + 2));
    compound_ref1_mode(*(byte *)((long)&local_28->error_code + 2));
  }
  xd_00 = (MACROBLOCKD *)(local_58 + 8);
  cm_00 = (AV1_COMMON *)local_58;
  cm_01 = (AV1_COMMON *)CONCAT44(uVar10,iVar6);
  xd_01 = (MACROBLOCKD *)CONCAT44(iVar8,local_48);
  iVar6 = assign_mv((AV1_COMMON *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                    in_stack_fffffffffffffe00,in_stack_fffffffffffffdff,ref_frame_00,mv,
                    (int_mv *)CONCAT44(iVar6,uVar13),in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                    (aom_reader *)in_stack_fffffffffffffe40);
  aom_merge_corrupted_flag((int *)(local_20 + 0x3ad0),(uint)((iVar6 != 0 ^ 0xffU) & 1));
  *(ushort *)((long)local_28->detail + 0x9f) = *(ushort *)((long)local_28->detail + 0x9f) & 0xfbff;
  if (((*(char *)(*(long *)(local_38 + 0x6088) + 0x3e) != '\0') &&
      ((*(ushort *)((long)local_28->detail + 0x9f) >> 6 & 1) == 0)) &&
     (iVar6 = is_interintra_allowed((MB_MODE_INFO *)cm_00), iVar6 != 0)) {
    in_stack_fffffffffffffdc4 = (uint)""[local_41];
    in_stack_fffffffffffffdc0 = aom_read_symbol_((aom_reader *)cm_00,(aom_cdf_prob *)xd_00,0);
    if (in_stack_fffffffffffffdc0 != 0) {
      IVar2 = read_interintra_mode((MACROBLOCKD *)cm_00,(aom_reader *)xd_00,0);
      in_stack_fffffffffffffdbc = CONCAT13(IVar2,(int3)in_stack_fffffffffffffdbc);
      *(MV_REFERENCE_FRAME *)((long)local_28->detail + 9) = '\0';
      *(INTERINTRA_MODE *)((int_mv *)local_28->detail + 0xe) = IVar2;
      *(int8_t *)((int_mv *)local_28->detail + 0x14) = '\0';
      *(int8_t *)((long)local_28->detail + 0x51) = '\0';
      *(uint8_t *)((long)local_28->detail + 0x53) = '\0';
      iVar6 = av1_is_wedge_used(local_41);
      if (iVar6 != 0) {
        iVar6 = aom_read_symbol_((aom_reader *)cm_00,(aom_cdf_prob *)xd_00,0);
        *(ushort *)((long)local_28->detail + 0x9f) =
             *(ushort *)((long)local_28->detail + 0x9f) & 0xfbff | ((byte)iVar6 & 1) << 10;
        if ((*(ushort *)((long)local_28->detail + 0x9f) >> 10 & 1) != 0) {
          iVar6 = aom_read_symbol_((aom_reader *)cm_00,(aom_cdf_prob *)xd_00,0);
          *(int8_t *)((long)local_28->detail + 0x39) = (int8_t)iVar6;
        }
      }
    }
  }
  iVar6 = 0;
  cm_02 = local_30;
  while (iVar7 = iVar6, iVar8 = has_second_ref((MB_MODE_INFO *)local_28), iVar6 < iVar8 + 1) {
    in_stack_fffffffffffffdb4 =
         CONCAT13(*(undefined1 *)((long)local_28->detail + (long)iVar7 + 8),
                  (int3)in_stack_fffffffffffffdb4);
    psVar9 = get_ref_scale_factors_const(cm_00,(MV_REFERENCE_FRAME)((ulong)xd_00 >> 0x38));
    *(scale_factors **)(ref_frame_00 + (long)iVar7 * 8 + 0x1f08) = psVar9;
    iVar6 = iVar7 + 1;
  }
  *(MOTION_MODE *)((int_mv *)local_28->detail + 4) = '\0';
  iVar8 = is_motion_variation_allowed_bsize((BLOCK_SIZE)local_28->error_code);
  if (((iVar8 != 0) && ((*(ushort *)((long)local_28->detail + 0x9f) >> 6 & 1) == 0)) &&
     (iVar8 = has_second_ref((MB_MODE_INFO *)local_28), iVar8 == 0)) {
    uVar3 = av1_findSamples(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                            (int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                            (int *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    *(uint8_t *)((long)local_28->detail + 0x11) = uVar3;
  }
  av1_count_overlappable_neighbors(cm_00,xd_00);
  if (*(MV_REFERENCE_FRAME *)((long)local_28->detail + 9) != '\0') {
    MVar4 = read_motion_mode(cm_02,xd_01,(MB_MODE_INFO *)cm_01,(aom_reader *)cm_00);
    *(MOTION_MODE *)((int_mv *)local_28->detail + 4) = MVar4;
  }
  *(ushort *)((long)local_28->detail + 0x9f) = *(ushort *)((long)local_28->detail + 0x9f) & 0xfeff;
  *(ushort *)((long)local_28->detail + 0x9f) =
       *(ushort *)((long)local_28->detail + 0x9f) & 0xfdff | 0x200;
  *(COMPOUND_TYPE *)((long)local_28->detail + 0x4b) = '\0';
  iVar8 = has_second_ref((MB_MODE_INFO *)local_28);
  if ((iVar8 != 0) && ((*(ushort *)((long)local_28->detail + 0x9f) >> 6 & 1) == 0)) {
    iVar8 = is_any_masked_compound_used((BLOCK_SIZE)((ulong)cm_00 >> 0x18));
    in_stack_fffffffffffffd97 = false;
    if (iVar8 != 0) {
      in_stack_fffffffffffffd97 = *(char *)(*(long *)(local_38 + 0x6088) + 0x3f) != '\0';
    }
    in_stack_fffffffffffffdb0 = (uint)(byte)in_stack_fffffffffffffd97;
    if (in_stack_fffffffffffffdb0 != 0) {
      get_comp_group_idx_context(xd_01);
      iVar8 = aom_read_symbol_((aom_reader *)cm_00,(aom_cdf_prob *)xd_00,0);
      *(ushort *)((long)local_28->detail + 0x9f) =
           *(ushort *)((long)local_28->detail + 0x9f) & 0xfeff | ((byte)iVar8 & 1) << 8;
    }
    if ((*(ushort *)((long)local_28->detail + 0x9f) & 0x100) == 0) {
      if (*(int *)(*(long *)(local_38 + 0x6088) + 0x30) == 0) {
        *(ushort *)((long)local_28->detail + 0x9f) =
             *(ushort *)((long)local_28->detail + 0x9f) & 0xfdff | 0x200;
        *(COMPOUND_TYPE *)((long)local_28->detail + 0x4b) = '\0';
      }
      else {
        get_comp_index_context
                  ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffdbc,iVar7));
        iVar8 = aom_read_symbol_((aom_reader *)cm_00,(aom_cdf_prob *)xd_00,0);
        *(ushort *)((long)local_28->detail + 0x9f) =
             *(ushort *)((long)local_28->detail + 0x9f) & 0xfdff | ((byte)iVar8 & 1) << 9;
        *(bool *)((long)local_28->detail + 0x4b) =
             ((byte)((ushort)*(undefined2 *)((long)local_28->detail + 0x9f) >> 9) & 1) == 0;
      }
    }
    else {
      iVar8 = is_interinter_compound_used
                        ((COMPOUND_TYPE)((ulong)cm_00 >> 0x18),(BLOCK_SIZE)((ulong)cm_00 >> 0x10));
      if (iVar8 == 0) {
        *(COMPOUND_TYPE *)((long)local_28->detail + 0x4b) = '\x03';
      }
      else {
        iVar8 = aom_read_symbol_((aom_reader *)cm_00,(aom_cdf_prob *)xd_00,0);
        *(COMPOUND_TYPE *)((long)local_28->detail + 0x4b) = (char)iVar8 + '\x02';
      }
      if (*(COMPOUND_TYPE *)((long)local_28->detail + 0x4b) == '\x02') {
        iVar8 = aom_read_symbol_((aom_reader *)cm_00,(aom_cdf_prob *)xd_00,0);
        *(int8_t *)((int_mv *)local_28->detail + 0x12) = (int8_t)iVar8;
        iVar8 = aom_read_bit_((aom_reader *)cm_00);
        *(int8_t *)((long)local_28->detail + 0x49) = (int8_t)iVar8;
      }
      else {
        iVar8 = aom_read_literal_((aom_reader *)cm_00,(int)((ulong)xd_00 >> 0x20));
        *(DIFFWTD_MASK_TYPE *)((long)local_28->detail + 0x4a) = (DIFFWTD_MASK_TYPE)iVar8;
      }
    }
  }
  iVar8 = (int)((ulong)xd_01 >> 0x20);
  read_mb_interp_filter
            ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             interp_filter,(_Bool)enable_dual_filter,
             (MB_MODE_INFO *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
             (aom_reader *)cm_02);
  if (*(MOTION_MODE *)((int_mv *)local_28->detail + 4) == '\x02') {
    uVar13 = *(undefined4 *)ref_frame_00;
    np = *(int *)(ref_frame_00 + 4);
    *(TransformationType *)((int_mv *)local_28->detail + 0xd) = '\x03';
    *(int8_t *)((long)local_28->detail + 0x35) = '\0';
    if (1 < *(uint8_t *)((long)local_28->detail + 0x11)) {
      uVar3 = av1_selectSamples((MV *)CONCAT44(uVar13,np),
                                (int *)CONCAT17(interp_filter,
                                                CONCAT16(enable_dual_filter,CONCAT24(uVar12,iVar6)))
                                ,(int *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90
                                                ),(int)((ulong)cm_02 >> 0x20),
                                (BLOCK_SIZE)((ulong)cm_02 >> 0x18));
      *(uint8_t *)((long)local_28->detail + 0x11) = uVar3;
    }
    cm_00 = (AV1_COMMON *)CONCAT44((int)((ulong)cm_00 >> 0x20),uVar13);
    cm_01 = (AV1_COMMON *)CONCAT44((int)((ulong)cm_01 >> 0x20),np);
    iVar6 = av1_find_projection(np,(int *)CONCAT17(interp_filter,
                                                   CONCAT16(enable_dual_filter,
                                                            CONCAT24(uVar12,iVar6))),
                                (int *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90)
                                ,(BLOCK_SIZE)((ulong)cm_02 >> 0x38),(int)cm_02,iVar8,
                                (WarpedMotionParams *)
                                CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),iVar7,
                                in_stack_fffffffffffffdc0);
    if (iVar6 != 0) {
      *(int8_t *)((long)local_28->detail + 0x35) = '\x01';
    }
  }
  bVar5 = store_cfl_required(cm_01,(MACROBLOCKD *)cm_00);
  *(uint *)(ref_frame_00 + 0x3ab0) = (uint)bVar5;
  return;
}

Assistant:

static void read_inter_block_mode_info(AV1Decoder *const pbi,
                                       DecoderCodingBlock *dcb,
                                       MB_MODE_INFO *const mbmi,
                                       aom_reader *r) {
  AV1_COMMON *const cm = &pbi->common;
  FeatureFlags *const features = &cm->features;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int allow_hp = features->allow_high_precision_mv;
  int_mv nearestmv[2], nearmv[2];
  int_mv ref_mvs[MODE_CTX_REF_FRAMES][MAX_MV_REF_CANDIDATES] = { { { 0 } } };
  int16_t inter_mode_ctx[MODE_CTX_REF_FRAMES];
  int pts[SAMPLES_ARRAY_SIZE], pts_inref[SAMPLES_ARRAY_SIZE];
  MACROBLOCKD *const xd = &dcb->xd;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;

  mbmi->uv_mode = UV_DC_PRED;
  mbmi->palette_mode_info.palette_size[0] = 0;
  mbmi->palette_mode_info.palette_size[1] = 0;

  av1_collect_neighbors_ref_counts(xd);

  read_ref_frames(cm, xd, r, mbmi->segment_id, mbmi->ref_frame);
  const int is_compound = has_second_ref(mbmi);

  const MV_REFERENCE_FRAME ref_frame = av1_ref_frame_type(mbmi->ref_frame);
  av1_find_mv_refs(cm, xd, mbmi, ref_frame, dcb->ref_mv_count, xd->ref_mv_stack,
                   xd->weight, ref_mvs, /*global_mvs=*/NULL, inter_mode_ctx);

  mbmi->ref_mv_idx = 0;

  if (mbmi->skip_mode) {
    assert(is_compound);
    mbmi->mode = NEAREST_NEARESTMV;
  } else {
    if (segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP) ||
        segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_GLOBALMV)) {
      mbmi->mode = GLOBALMV;
    } else {
      const int mode_ctx =
          av1_mode_context_analyzer(inter_mode_ctx, mbmi->ref_frame);
      if (is_compound)
        mbmi->mode = read_inter_compound_mode(xd, r, mode_ctx);
      else
        mbmi->mode = read_inter_mode(ec_ctx, r, mode_ctx);
      if (mbmi->mode == NEWMV || mbmi->mode == NEW_NEWMV ||
          have_nearmv_in_inter_mode(mbmi->mode))
        read_drl_idx(ec_ctx, dcb, mbmi, r);
    }
  }

  if (is_compound != is_inter_compound_mode(mbmi->mode)) {
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Prediction mode %d invalid with ref frame %d %d",
                       mbmi->mode, mbmi->ref_frame[0], mbmi->ref_frame[1]);
  }

  if (!is_compound && mbmi->mode != GLOBALMV) {
    av1_find_best_ref_mvs(allow_hp, ref_mvs[mbmi->ref_frame[0]], &nearestmv[0],
                          &nearmv[0], features->cur_frame_force_integer_mv);
  }

  if (is_compound && mbmi->mode != GLOBAL_GLOBALMV) {
    const int ref_mv_idx = mbmi->ref_mv_idx + 1;
    nearestmv[0] = xd->ref_mv_stack[ref_frame][0].this_mv;
    nearestmv[1] = xd->ref_mv_stack[ref_frame][0].comp_mv;
    nearmv[0] = xd->ref_mv_stack[ref_frame][ref_mv_idx].this_mv;
    nearmv[1] = xd->ref_mv_stack[ref_frame][ref_mv_idx].comp_mv;
    lower_mv_precision(&nearestmv[0].as_mv, allow_hp,
                       features->cur_frame_force_integer_mv);
    lower_mv_precision(&nearestmv[1].as_mv, allow_hp,
                       features->cur_frame_force_integer_mv);
    lower_mv_precision(&nearmv[0].as_mv, allow_hp,
                       features->cur_frame_force_integer_mv);
    lower_mv_precision(&nearmv[1].as_mv, allow_hp,
                       features->cur_frame_force_integer_mv);
  } else if (mbmi->ref_mv_idx > 0 && mbmi->mode == NEARMV) {
    nearmv[0] =
        xd->ref_mv_stack[mbmi->ref_frame[0]][1 + mbmi->ref_mv_idx].this_mv;
  }

  int_mv ref_mv[2] = { nearestmv[0], nearestmv[1] };

  if (is_compound) {
    int ref_mv_idx = mbmi->ref_mv_idx;
    // Special case: NEAR_NEWMV and NEW_NEARMV modes use
    // 1 + mbmi->ref_mv_idx (like NEARMV) instead of
    // mbmi->ref_mv_idx (like NEWMV)
    if (mbmi->mode == NEAR_NEWMV || mbmi->mode == NEW_NEARMV)
      ref_mv_idx = 1 + mbmi->ref_mv_idx;

    // TODO(jingning, yunqing): Do we need a lower_mv_precision() call here?
    if (compound_ref0_mode(mbmi->mode) == NEWMV)
      ref_mv[0] = xd->ref_mv_stack[ref_frame][ref_mv_idx].this_mv;

    if (compound_ref1_mode(mbmi->mode) == NEWMV)
      ref_mv[1] = xd->ref_mv_stack[ref_frame][ref_mv_idx].comp_mv;
  } else {
    if (mbmi->mode == NEWMV) {
      if (dcb->ref_mv_count[ref_frame] > 1)
        ref_mv[0] = xd->ref_mv_stack[ref_frame][mbmi->ref_mv_idx].this_mv;
    }
  }

  if (mbmi->skip_mode) assert(mbmi->mode == NEAREST_NEARESTMV);

  const int mv_corrupted_flag =
      !assign_mv(cm, xd, mbmi->mode, mbmi->ref_frame, mbmi->mv, ref_mv,
                 nearestmv, nearmv, is_compound, allow_hp, r);
  aom_merge_corrupted_flag(&dcb->corrupted, mv_corrupted_flag);

  mbmi->use_wedge_interintra = 0;
  if (cm->seq_params->enable_interintra_compound && !mbmi->skip_mode &&
      is_interintra_allowed(mbmi)) {
    const int bsize_group = size_group_lookup[bsize];
    const int interintra =
        aom_read_symbol(r, ec_ctx->interintra_cdf[bsize_group], 2, ACCT_STR);
    assert(mbmi->ref_frame[1] == NONE_FRAME);
    if (interintra) {
      const INTERINTRA_MODE interintra_mode =
          read_interintra_mode(xd, r, bsize_group);
      mbmi->ref_frame[1] = INTRA_FRAME;
      mbmi->interintra_mode = interintra_mode;
      mbmi->angle_delta[PLANE_TYPE_Y] = 0;
      mbmi->angle_delta[PLANE_TYPE_UV] = 0;
      mbmi->filter_intra_mode_info.use_filter_intra = 0;
      if (av1_is_wedge_used(bsize)) {
        mbmi->use_wedge_interintra = aom_read_symbol(
            r, ec_ctx->wedge_interintra_cdf[bsize], 2, ACCT_STR);
        if (mbmi->use_wedge_interintra) {
          mbmi->interintra_wedge_index = (int8_t)aom_read_symbol(
              r, ec_ctx->wedge_idx_cdf[bsize], MAX_WEDGE_TYPES, ACCT_STR);
        }
      }
    }
  }

  for (int ref = 0; ref < 1 + has_second_ref(mbmi); ++ref) {
    const MV_REFERENCE_FRAME frame = mbmi->ref_frame[ref];
    xd->block_ref_scale_factors[ref] = get_ref_scale_factors_const(cm, frame);
  }

  mbmi->motion_mode = SIMPLE_TRANSLATION;
  if (is_motion_variation_allowed_bsize(mbmi->bsize) && !mbmi->skip_mode &&
      !has_second_ref(mbmi)) {
    mbmi->num_proj_ref = av1_findSamples(cm, xd, pts, pts_inref);
  }
  av1_count_overlappable_neighbors(cm, xd);

  if (mbmi->ref_frame[1] != INTRA_FRAME)
    mbmi->motion_mode = read_motion_mode(cm, xd, mbmi, r);

  // init
  mbmi->comp_group_idx = 0;
  mbmi->compound_idx = 1;
  mbmi->interinter_comp.type = COMPOUND_AVERAGE;

  if (has_second_ref(mbmi) && !mbmi->skip_mode) {
    // Read idx to indicate current compound inter prediction mode group
    const int masked_compound_used = is_any_masked_compound_used(bsize) &&
                                     cm->seq_params->enable_masked_compound;

    if (masked_compound_used) {
      const int ctx_comp_group_idx = get_comp_group_idx_context(xd);
      mbmi->comp_group_idx = (uint8_t)aom_read_symbol(
          r, ec_ctx->comp_group_idx_cdf[ctx_comp_group_idx], 2, ACCT_STR);
    }

    if (mbmi->comp_group_idx == 0) {
      if (cm->seq_params->order_hint_info.enable_dist_wtd_comp) {
        const int comp_index_ctx = get_comp_index_context(cm, xd);
        mbmi->compound_idx = (uint8_t)aom_read_symbol(
            r, ec_ctx->compound_index_cdf[comp_index_ctx], 2, ACCT_STR);
        mbmi->interinter_comp.type =
            mbmi->compound_idx ? COMPOUND_AVERAGE : COMPOUND_DISTWTD;
      } else {
        // Distance-weighted compound is disabled, so always use average
        mbmi->compound_idx = 1;
        mbmi->interinter_comp.type = COMPOUND_AVERAGE;
      }
    } else {
      assert(cm->current_frame.reference_mode != SINGLE_REFERENCE &&
             is_inter_compound_mode(mbmi->mode) &&
             mbmi->motion_mode == SIMPLE_TRANSLATION);
      assert(masked_compound_used);

      // compound_diffwtd, wedge
      if (is_interinter_compound_used(COMPOUND_WEDGE, bsize)) {
        mbmi->interinter_comp.type =
            COMPOUND_WEDGE + aom_read_symbol(r,
                                             ec_ctx->compound_type_cdf[bsize],
                                             MASKED_COMPOUND_TYPES, ACCT_STR);
      } else {
        mbmi->interinter_comp.type = COMPOUND_DIFFWTD;
      }

      if (mbmi->interinter_comp.type == COMPOUND_WEDGE) {
        assert(is_interinter_compound_used(COMPOUND_WEDGE, bsize));
        mbmi->interinter_comp.wedge_index = (int8_t)aom_read_symbol(
            r, ec_ctx->wedge_idx_cdf[bsize], MAX_WEDGE_TYPES, ACCT_STR);
        mbmi->interinter_comp.wedge_sign = (int8_t)aom_read_bit(r, ACCT_STR);
      } else {
        assert(mbmi->interinter_comp.type == COMPOUND_DIFFWTD);
        mbmi->interinter_comp.mask_type =
            aom_read_literal(r, MAX_DIFFWTD_MASK_BITS, ACCT_STR);
      }
    }
  }

  read_mb_interp_filter(xd, features->interp_filter,
                        cm->seq_params->enable_dual_filter, mbmi, r);

  if (mbmi->motion_mode == WARPED_CAUSAL) {
    const int mi_row = xd->mi_row;
    const int mi_col = xd->mi_col;
    mbmi->wm_params.wmtype = DEFAULT_WMTYPE;
    mbmi->wm_params.invalid = 0;

    if (mbmi->num_proj_ref > 1) {
      mbmi->num_proj_ref = av1_selectSamples(&mbmi->mv[0].as_mv, pts, pts_inref,
                                             mbmi->num_proj_ref, bsize);
    }

    if (av1_find_projection(mbmi->num_proj_ref, pts, pts_inref, bsize,
                            mbmi->mv[0].as_mv.row, mbmi->mv[0].as_mv.col,
                            &mbmi->wm_params, mi_row, mi_col)) {
#if WARPED_MOTION_DEBUG
      printf("Warning: unexpected warped model from aomenc\n");
#endif
      mbmi->wm_params.invalid = 1;
    }
  }

  xd->cfl.store_y = store_cfl_required(cm, xd);

#if DEC_MISMATCH_DEBUG
  dec_dump_logs(cm, mi, mi_row, mi_col, mode_ctx);
#endif  // DEC_MISMATCH_DEBUG
}